

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::TextFormat::PrintUnknownFields
               (UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer local_a0;
  ZeroCopyOutputStream *local_18;
  ZeroCopyOutputStream *output_local;
  UnknownFieldSet *unknown_fields_local;
  
  local_18 = output;
  output_local = (ZeroCopyOutputStream *)unknown_fields;
  Printer::Printer(&local_a0);
  bVar1 = Printer::PrintUnknownFields(&local_a0,(UnknownFieldSet *)output_local,local_18);
  Printer::~Printer(&local_a0);
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, io::ZeroCopyOutputStream* output) {
  return Printer().PrintUnknownFields(unknown_fields, output);
}